

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

void CreatePath(char *fn)

{
  int iVar1;
  char *__file;
  undefined1 local_b0 [8];
  stat info;
  char *p;
  char *copy;
  char *fn_local;
  
  if ((*fn != '/') || (fn[1] != '\0')) {
    __file = strdup(fn);
    info.__glibc_reserved[2] = (__syscall_slong_t)__file;
    while( true ) {
      info.__glibc_reserved[2] =
           (__syscall_slong_t)strchr((char *)(info.__glibc_reserved[2] + 1),0x2f);
      if ((char *)info.__glibc_reserved[2] != (char *)0x0) {
        *(char *)info.__glibc_reserved[2] = '\0';
      }
      iVar1 = stat(__file,(stat *)local_b0);
      if (((iVar1 != 0) || (((uint)info.st_nlink & 0x4000) == 0)) &&
         (iVar1 = mkdir(__file,0x1ed), iVar1 == -1)) {
        free(__file);
        return;
      }
      if (info.__glibc_reserved[2] == 0) break;
      *(undefined1 *)info.__glibc_reserved[2] = 0x2f;
    }
    free(__file);
  }
  return;
}

Assistant:

void CreatePath(const char *fn)
{
	char *copy, *p;
 
	if (fn[0] == '/' && fn[1] == '\0')
	{
		return;
	}
	p = copy = strdup(fn);
	do
	{
		p = strchr(p + 1, '/');
		if (p != NULL)
		{
			*p = '\0';
		}
		struct stat info;
		if (stat(copy, &info) == 0)
		{
			if (info.st_mode & S_IFDIR)
				goto exists;
		}
		if (mkdir(copy, 0755) == -1)
		{ // failed
			free(copy);
			return;
		}
exists:	if (p != NULL)
		{
			*p = '/';
		}
	} while (p);
	free(copy);
}